

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::TiledInputFile::~TiledInputFile(TiledInputFile *this)

{
  IStream *pIVar1;
  InputStreamMutex *pIVar2;
  Data *this_00;
  pointer ppTVar3;
  ulong uVar4;
  
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_0300ce10;
  if ((this->_data->memoryMapped == false) &&
     (ppTVar3 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (this->_data->tileBuffers).
     super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
     ._M_impl.super__Vector_impl_data._M_finish != ppTVar3)) {
    uVar4 = 0;
    do {
      if (ppTVar3[uVar4]->buffer != (char *)0x0) {
        operator_delete__(ppTVar3[uVar4]->buffer);
      }
      uVar4 = uVar4 + 1;
      ppTVar3 = (this->_data->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->_data->tileBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3))
    ;
  }
  if ((this->_data->_deleteStream == true) &&
     (pIVar1 = this->_data->_streamData->is, pIVar1 != (IStream *)0x0)) {
    (*pIVar1->_vptr_IStream[1])();
  }
  if ((this->_data->partNumber == -1) &&
     (pIVar2 = this->_data->_streamData, pIVar2 != (InputStreamMutex *)0x0)) {
    operator_delete(pIVar2,0x38);
  }
  this_00 = this->_data;
  if (this_00 != (Data *)0x0) {
    Data::~Data(this_00);
    operator_delete(this_00,0x180);
  }
  GenericInputFile::~GenericInputFile(&this->super_GenericInputFile);
  return;
}

Assistant:

TiledInputFile::~TiledInputFile ()
{
    if (!_data->memoryMapped)
        for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            delete [] _data->tileBuffers[i]->buffer;

    if (_data->_deleteStream)
        delete _data->_streamData->is;

    if (_data->partNumber == -1)
        delete _data->_streamData;

    delete _data;
}